

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  unsigned_short **ppuVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *pcVar8;
  long lVar9;
  unsigned_short *in_R8;
  char **ppcVar10;
  byte *pbVar11;
  char **ppcVar12;
  char *pcStack_40;
  
  if (ptr == end) {
    return -4;
  }
  iVar3 = 0x12;
  lVar9 = 1;
  ppuVar7 = (unsigned_short **)0xffffffffffffffff;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar5 = (byte *)(ptr + 1);
    if (pbVar5 == (byte *)end) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
    switch(bVar1) {
    case 0xf:
      iVar3 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar3;
    case 0x10:
      pbVar5 = (byte *)(ptr + 2);
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
      case 0x14:
        *nextTokPtr = ptr + 3;
        return 0x21;
      case 0x16:
      case 0x18:
        pbVar11 = (byte *)(ptr + 4);
LAB_0015197f:
        pbVar5 = pbVar11 + -1;
        if (pbVar5 == (byte *)end) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
        switch(bVar1) {
        case 0x15:
          break;
        case 0x16:
        case 0x18:
          goto switchD_001519ac_caseD_16;
        case 0x17:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
          goto switchD_00151766_caseD_11;
        case 0x1e:
          if (pbVar11 == (byte *)end) {
            return -1;
          }
          uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar11);
          if ((uVar6 < 0x1f) && ((0x40200600U >> (uVar6 & 0x1f) & 1) != 0))
          goto switchD_00151766_caseD_11;
          break;
        default:
          if (1 < bVar1 - 9) goto switchD_00151766_caseD_11;
        }
        *nextTokPtr = (char *)pbVar5;
        return 0x10;
      case 0x1b:
        iVar3 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar3;
      }
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_00151766_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_00151766_caseD_16;
    }
switchD_00151766_caseD_11:
    *nextTokPtr = (char *)pbVar5;
    return 0;
  default:
    goto switchD_00151274_caseD_3;
  case 4:
    pcVar8 = ptr + 1;
    if (pcVar8 == end) {
      iVar3 = -0x1a;
    }
    else {
      if (*pcVar8 == ']') {
        if (ptr + 2 == end) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar8;
      iVar3 = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
    lVar9 = 2;
    if (iVar4 != 0) goto switchD_00151274_caseD_16;
    iVar4 = (*enc[2].isPublicId)(enc,ptr,extraout_RDX_02,(char **)ppuVar7);
    goto LAB_001517d5;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[0])(enc,ptr,(char *)0x13,(char **)0xffffffffffffffff);
    lVar9 = 3;
    if (iVar4 != 0) goto switchD_00151274_caseD_16;
    iVar4 = (*enc[2].utf8Convert)(enc,(char **)ptr,extraout_RDX_00,(char **)ppuVar7,(char *)in_R8);
    goto LAB_001517d5;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[1])(enc,ptr,(char *)0x13,(char **)0xffffffffffffffff);
    lVar9 = 4;
    if (iVar4 != 0) goto switchD_00151274_caseD_16;
    iVar4 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_01,ppuVar7,in_R8);
LAB_001517d5:
    iVar3 = 0x13;
    if (iVar4 == 0) {
switchD_00151274_caseD_3:
      *nextTokPtr = ptr;
      return 0;
    }
switchD_00151274_caseD_16:
    ppcVar12 = (char **)(ptr + lVar9);
LAB_00151286:
    iVar4 = iVar3;
    ppcVar10 = ppcVar12;
    if (ppcVar10 == (char **)end) {
      return -iVar4;
    }
    iVar3 = iVar4;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10)) {
    case 5:
      if ((long)end - (long)ppcVar10 < 2) {
        return -2;
      }
      iVar4 = (*enc[2].isPublicId)(enc,(char *)ppcVar10,(char *)0x13,(char **)ppuVar7);
      if (iVar4 != 0) {
        ppcVar12 = (char **)((long)ppcVar10 + 2);
        goto LAB_00151286;
      }
      break;
    case 6:
      if ((long)end - (long)ppcVar10 < 3) {
        return -2;
      }
      iVar4 = (*enc[2].utf8Convert)(enc,ppcVar10,(char *)0x13,(char **)ppuVar7,(char *)in_R8);
      if (iVar4 != 0) {
        ppcVar12 = (char **)((long)ppcVar10 + 3);
        goto LAB_00151286;
      }
      break;
    case 7:
      if ((long)end - (long)ppcVar10 < 4) {
        return -2;
      }
      iVar4 = (*enc[2].utf16Convert)(enc,ppcVar10,(char *)0x13,ppuVar7,in_R8);
      if (iVar4 != 0) {
        ppcVar12 = (char **)((long)ppcVar10 + 4);
        goto LAB_00151286;
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0x14:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x23:
    case 0x24:
      goto switchD_001512b3_caseD_9;
    case 0xf:
      if (iVar4 != 0x13) {
        *nextTokPtr = (char *)((long)ppcVar10 + 1);
        return 0x1e;
      }
      break;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      ppcVar12 = (char **)((long)ppcVar10 + 1);
      goto LAB_00151286;
    case 0x17:
      ppcVar12 = (char **)((long)ppcVar10 + 1);
      iVar3 = 0x13;
      if ((iVar4 != 0x29) && (iVar3 = iVar4, iVar4 == 0x12)) {
        if (ppcVar12 == (char **)end) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12);
        ppuVar7 = (unsigned_short **)(ulong)(bVar1 - 0x18);
        if (bVar1 - 0x18 < 4) {
LAB_00151319:
          ppcVar12 = (char **)((long)ppcVar10 + 2);
          iVar3 = 0x29;
        }
        else if (bVar1 == 5) {
          if ((long)end - (long)ppcVar12 < 2) {
            return -2;
          }
          iVar3 = (*enc[2].isPublicId)(enc,(char *)ppcVar12,(char *)0x13,(char **)ppuVar7);
          if (iVar3 == 0) goto LAB_001519f6;
          ppcVar12 = (char **)((long)ppcVar10 + 3);
LAB_001513ad:
          iVar3 = 0x29;
        }
        else {
          if (bVar1 == 6) {
            if ((long)end - (long)ppcVar12 < 3) {
              return -2;
            }
            iVar3 = (*enc[2].utf8Convert)(enc,ppcVar12,(char *)0x13,(char **)ppuVar7,(char *)in_R8);
            if (iVar3 != 0) {
              ppcVar12 = (char **)((long)ppcVar10 + 4);
              goto LAB_001513ad;
            }
            goto LAB_001519f6;
          }
          if (bVar1 == 7) {
            if ((long)end - (long)ppcVar12 < 4) {
              return -2;
            }
            iVar3 = (*enc[2].utf16Convert)(enc,ppcVar12,(char *)0x13,ppuVar7,in_R8);
            if (iVar3 != 0) {
              ppcVar12 = (char **)((long)ppcVar10 + 5);
              goto LAB_001513ad;
            }
            goto LAB_001519f6;
          }
          if (bVar1 == 0x16) goto LAB_00151319;
          iVar3 = 0x13;
          if (bVar1 == 0x1d) {
LAB_001519f6:
            *nextTokPtr = (char *)ppcVar12;
            return 0;
          }
        }
      }
      goto LAB_00151286;
    case 0x21:
      if (iVar4 != 0x13) {
        *nextTokPtr = (char *)((long)ppcVar10 + 1);
        return 0x1f;
      }
      break;
    case 0x22:
      if (iVar4 != 0x13) {
        *nextTokPtr = (char *)((long)ppcVar10 + 1);
        return 0x20;
      }
    }
    *nextTokPtr = (char *)ppcVar10;
    return 0;
  case 9:
    if (ptr + 1 == end) {
      return -0xf;
    }
  case 10:
  case 0x15:
    do {
      pbVar5 = (byte *)ptr;
      ptr = (char *)(pbVar5 + 1);
      if (ptr == end) {
        *nextTokPtr = end;
        goto LAB_001516f0;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    } while (((cVar2 == '\x15') || (cVar2 == '\n')) ||
            ((cVar2 == '\t' && (pbVar5 + 2 != (byte *)end))));
    *nextTokPtr = ptr;
LAB_001516f0:
    iVar3 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x11;
    break;
  case 0xc:
    pcStack_40._0_4_ = 0xc;
    goto LAB_00151556;
  case 0xd:
    pcStack_40._0_4_ = 0xd;
LAB_00151556:
    iVar3 = normal_scanLit((int)pcStack_40,enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 0x13:
    ppcVar10 = (char **)(ptr + 1);
    if (ppcVar10 == (char **)end) {
      return -1;
    }
    pcStack_40 = (char *)0x2;
    cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10);
    iVar4 = 0;
    pcVar8 = pcStack_40;
    if (cVar2 != '\x18') {
      if (cVar2 == '\x06') {
        if ((long)end - (long)ppcVar10 < 3) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])(enc,(char *)ppcVar10,(char *)0x2,(char **)0x2);
        pcStack_40 = (char *)0x4;
        pcVar8 = extraout_RDX_03;
LAB_0015181d:
        if (iVar3 == 0) {
switchD_001512b3_caseD_9:
          *nextTokPtr = (char *)ppcVar10;
          return iVar4;
        }
      }
      else if (cVar2 == '\a') {
        if ((long)end - (long)ppcVar10 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[1])(enc,(char *)ppcVar10,(char *)0x2,(char **)0x2);
        iVar4 = 0;
        if (iVar3 == 0) goto switchD_001512b3_caseD_9;
        pcStack_40 = (char *)0x5;
        pcVar8 = extraout_RDX_04;
      }
      else if (cVar2 != '\x16') {
        if (cVar2 != '\x05') goto switchD_001512b3_caseD_9;
        if ((long)end - (long)ppcVar10 < 2) {
          return -2;
        }
        iVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar10);
        pcStack_40 = (char *)0x3;
        pcVar8 = extraout_RDX;
        goto LAB_0015181d;
      }
    }
    for (ppcVar10 = (char **)(ptr + (long)pcStack_40); ppcVar10 != (char **)end;
        ppcVar10 = (char **)((long)ppcVar10 + (long)pcStack_40)) {
      pcStack_40 = (char *)1;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10)) {
      case 5:
        if ((long)end - (long)ppcVar10 < 2) {
          return -2;
        }
        iVar3 = (*enc[2].isPublicId)(enc,(char *)ppcVar10,pcVar8,(char **)0x1);
        pcStack_40 = (char *)0x2;
        pcVar8 = extraout_RDX_05;
        break;
      case 6:
        if ((long)end - (long)ppcVar10 < 3) {
          return -2;
        }
        iVar3 = (*enc[2].utf8Convert)(enc,ppcVar10,pcVar8,(char **)0x1,(char *)in_R8);
        pcStack_40 = (char *)0x3;
        pcVar8 = extraout_RDX_06;
        break;
      case 7:
        if ((long)end - (long)ppcVar10 < 4) {
          return -2;
        }
        iVar3 = (*enc[2].utf16Convert)(enc,ppcVar10,pcVar8,(unsigned_short **)0x1,in_R8);
        pcStack_40 = (char *)0x4;
        pcVar8 = extraout_RDX_07;
        break;
      default:
        goto switchD_00151891_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        iVar4 = 0x14;
        goto switchD_001512b3_caseD_9;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_00151891_caseD_16;
      }
      if (iVar3 == 0) {
switchD_00151891_caseD_8:
        iVar4 = 0;
        goto switchD_001512b3_caseD_9;
      }
switchD_00151891_caseD_16:
    }
    iVar3 = -0x14;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_00151274_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar3 = 0x13;
    goto switchD_00151274_caseD_16;
  case 0x1e:
    iVar3 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar3;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x17;
    break;
  case 0x20:
    pbVar5 = (byte *)(ptr + 1);
    if (pbVar5 == (byte *)end) {
      return -0x18;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
    switch(bVar1) {
    case 0x20:
    case 0x23:
    case 0x24:
      goto switchD_00151781_caseD_20;
    case 0x21:
      *nextTokPtr = ptr + 2;
      return 0x24;
    case 0x22:
      *nextTokPtr = ptr + 2;
      return 0x25;
    default:
      if (2 < bVar1 - 9) {
        if (bVar1 == 0xf) {
          *nextTokPtr = ptr + 2;
          return 0x23;
        }
        if (bVar1 != 0x15) goto switchD_00151766_caseD_11;
      }
switchD_00151781_caseD_20:
      *nextTokPtr = (char *)pbVar5;
      return 0x18;
    }
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar3 = 0x15;
  }
  return iVar3;
switchD_001519ac_caseD_16:
  pbVar11 = pbVar11 + 1;
  goto LAB_0015197f;
}

Assistant:

static
int PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  int tok;
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end)
      return -XML_TOK_PROLOG_S;
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (ptr == end)
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        if (ptr == end)
          return XML_TOK_PARTIAL;
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}